

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqComms.cpp
# Opt level: O2

void __thiscall helics::zeromq::ZmqComms::queue_rx_function(ZmqComms *this)

{
  milliseconds *__rtime;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  void *data;
  size_t in_RCX;
  milliseconds timeout;
  socket_base sVar7;
  milliseconds *__n;
  ConnectionStatus status;
  sockaddr *__addr;
  sockaddr *__addr_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar8;
  string *psVar9;
  string *psVar10;
  context_t *context_;
  undefined8 in_R8;
  undefined8 uVar11;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  allocator<char> local_231;
  string *local_230;
  socket_t repSocket;
  string str;
  socket_t brokerReqTerm;
  vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> poller;
  socket_t pullSocket;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  socket_t controlSocket;
  shared_ptr<ZmqContextManager> ctx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  ActionMessage M;
  pollitem_t poller_1;
  string controlsockString;
  
  M._0_8_ = &M.dest_id;
  M.source_id.gid = 0;
  M.source_handle.hid = 0;
  M.dest_id.gid._0_1_ = 0;
  ZmqContextManager::getContextPointer((ZmqContextManager *)&ctx,(string *)&M);
  std::__cxx11::string::~string((string *)&M);
  zmq::socket_t::socket_t
            (&pullSocket,
             ((ctx.super___shared_ptr<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             zcontext)._M_t.
             super___uniq_ptr_impl<zmq::context_t,_std::default_delete<zmq::context_t>_>._M_t.
             super__Tuple_impl<0UL,_zmq::context_t_*,_std::default_delete<zmq::context_t>_>.
             super__Head_base<0UL,_zmq::context_t_*,_false>._M_head_impl,7);
  M.messageAction = 200;
  zmq::detail::socket_base::setsockopt<int>(&pullSocket.super_socket_base,0x11,&M.messageAction);
  zmq::socket_t::socket_t
            (&controlSocket,
             ((ctx.super___shared_ptr<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             zcontext)._M_t.
             super___uniq_ptr_impl<zmq::context_t,_std::default_delete<zmq::context_t>_>._M_t.
             super__Tuple_impl<0UL,_zmq::context_t_*,_std::default_delete<zmq::context_t>_>.
             super__Head_base<0UL,_zmq::context_t_*,_false>._M_head_impl,0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_190,"inproc://",(allocator<char> *)&local_150);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,
                 &local_190,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(this->super_NetworkCommsInterface).super_CommsInterface.name);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&poller,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,'_');
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&M,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&poller,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &(this->super_NetworkCommsInterface).super_CommsInterface.randomID);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &controlsockString,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&M,"_control")
  ;
  std::__cxx11::string::~string((string *)&M);
  std::__cxx11::string::~string((string *)&poller);
  std::__cxx11::string::~string((string *)&str);
  std::__cxx11::string::~string((string *)&local_190);
  zmq::detail::socket_base::bind
            (&controlSocket.super_socket_base,(int)controlsockString._M_dataplus._M_p,__addr,
             (socklen_t)in_RCX);
  M.messageAction = 200;
  zmq::detail::socket_base::setsockopt<int>(&controlSocket.super_socket_base,0x11,&M.messageAction);
  status = ERRORED;
  zmq::socket_t::socket_t
            (&repSocket,
             ((ctx.super___shared_ptr<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             zcontext)._M_t.
             super___uniq_ptr_impl<zmq::context_t,_std::default_delete<zmq::context_t>_>._M_t.
             super__Tuple_impl<0UL,_zmq::context_t_*,_std::default_delete<zmq::context_t>_>.
             super__Head_base<0UL,_zmq::context_t_*,_false>._M_head_impl,4);
  if ((this->super_NetworkCommsInterface).super_CommsInterface.serverMode == true) {
    M.messageAction = cmd_time_request;
    zmq::detail::socket_base::setsockopt<int>(&repSocket.super_socket_base,0x11,&M.messageAction);
  }
  local_230 = &(this->super_NetworkCommsInterface).super_CommsInterface.brokerName;
  while ((this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i == -1) {
    zmq::message_t::message_t((message_t *)&poller);
    zmq::detail::socket_base::recv
              (&controlSocket.super_socket_base,(int)(message_t *)&poller,(void *)0x0,in_RCX,
               (int)in_R8);
    sVar6 = zmq::message_t::size((message_t *)&poller);
    if (9 < sVar6) {
      data = zmq::message_t::data((message_t *)&poller);
      sVar6 = zmq::message_t::size((message_t *)&poller);
      ActionMessage::ActionMessage(&M,data,sVar6);
      if (((M.messageAction == cmd_protocol_priority) || (M.messageAction == cmd_protocol_big)) ||
         (M.messageAction == cmd_protocol)) {
        if (M.messageID != 0x5ab) {
          if (M.messageID == 0x9db) {
LAB_002607ab:
            status = TERMINATED;
          }
          else if (M.messageID != 0xa3f) {
            if (M.messageID != 0xaa6) {
              if (M.messageID != 0x16570bf) goto LAB_00260623;
              goto LAB_002607ab;
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_150,"broker name ",(allocator<char> *)&poller_1);
            std::operator+(&local_190,&local_150,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_230);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str
                           ,&local_190," does not match broker connection");
            message_01._M_str = str._M_dataplus._M_p;
            message_01._M_len = str._M_string_length;
            CommsInterface::logError((CommsInterface *)this,message_01);
            std::__cxx11::string::~string((string *)&str);
            std::__cxx11::string::~string((string *)&local_190);
            std::__cxx11::string::~string((string *)&local_150);
          }
          LOCK();
          (this->super_NetworkCommsInterface).super_CommsInterface.disconnecting._M_base._M_i = true
          ;
          UNLOCK();
          CommsInterface::setRxStatus((CommsInterface *)this,status);
          ActionMessage::~ActionMessage(&M);
          zmq::message_t::~message_t((message_t *)&poller);
          goto LAB_00260a78;
        }
        NetworkCommsInterface::loadPortDefinitions(&this->super_NetworkCommsInterface,&M);
      }
LAB_00260623:
      ActionMessage::~ActionMessage(&M);
    }
    zmq::message_t::~message_t((message_t *)&poller);
  }
  if ((this->super_NetworkCommsInterface).super_CommsInterface.serverMode == true) {
    psVar9 = &(this->super_NetworkCommsInterface).super_CommsInterface.localTargetAddress;
    timeout.__r = (this->super_NetworkCommsInterface).super_CommsInterface.connectionTimeout.__r;
    iVar4 = 200;
    local_230 = psVar9;
    bVar1 = bindzmqSocket(&repSocket,psVar9,
                          (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>.
                          _M_i + 1,timeout,(milliseconds)0xc8);
    iVar3 = (int)psVar9;
    if (!bVar1) {
      if ((this->super_NetworkCommsInterface).forceConnection != true) {
        zmq::socket_t::close(&pullSocket,iVar3);
        zmq::socket_t::close(&repSocket,iVar3);
        LOCK();
        (this->super_NetworkCommsInterface).super_CommsInterface.disconnecting._M_base._M_i = true;
        UNLOCK();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&poller,"Unable to bind zmq reply socket giving up ",
                   (allocator<char> *)&local_190);
        gmlc::networking::makePortAddress
                  (&str,local_230,
                   (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i + 1)
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&M,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&poller,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str);
        message_02._M_str = (char *)M._0_8_;
        message_02._M_len._0_4_ = M.source_id.gid;
        message_02._M_len._4_4_ = M.source_handle.hid;
        CommsInterface::logError((CommsInterface *)this,message_02);
        std::__cxx11::string::~string((string *)&M);
        std::__cxx11::string::~string((string *)&str);
        std::__cxx11::string::~string((string *)&poller);
        status = ERRORED;
        CommsInterface::setRxStatus((CommsInterface *)this,ERRORED);
        goto LAB_00260a78;
      }
      message_00._M_str = "attempting to override existing broker and force network connection";
      message_00._M_len = 0x43;
      CommsInterface::logWarning((CommsInterface *)this,message_00);
      zmq::socket_t::socket_t
                (&brokerReqTerm,
                 ((ctx.super___shared_ptr<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 zcontext)._M_t.
                 super___uniq_ptr_impl<zmq::context_t,_std::default_delete<zmq::context_t>_>._M_t.
                 super__Tuple_impl<0UL,_zmq::context_t_*,_std::default_delete<zmq::context_t>_>.
                 super__Head_base<0UL,_zmq::context_t_*,_false>._M_head_impl,3);
      M.messageAction = cmd_add_publisher;
      iVar3 = 0x11;
      zmq::detail::socket_base::setsockopt<int>
                (&brokerReqTerm.super_socket_base,0x11,&M.messageAction);
      zmq::socket_t::close(&repSocket,iVar3);
      gmlc::networking::makePortAddress
                ((string *)&M,local_230,
                 (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i + 1);
      zmq::detail::socket_base::connect
                (&brokerReqTerm.super_socket_base,M.messageAction,__addr_00,(socklen_t)timeout.__r);
      std::__cxx11::string::~string((string *)&M);
      ActionMessage::ActionMessage(&M,cmd_global_error);
      M.messageID = 0x8f;
      SmallBuffer::operator=(&M.payload,(char (*) [33])"force termination for new broker");
      if ((this->super_NetworkCommsInterface).super_CommsInterface.useJsonSerialization == true) {
        ActionMessage::to_json_string_abi_cxx11_(&str,&M);
      }
      else {
        ActionMessage::to_string_abi_cxx11_(&str,&M);
      }
      zmq::detail::socket_base::send
                (&brokerReqTerm.super_socket_base,(int)&str,(void *)0x0,timeout.__r,iVar4);
      __rtime = &(this->super_NetworkCommsInterface).super_CommsInterface.connectionTimeout;
      poller_1.socket = brokerReqTerm.super_socket_base._handle;
      poller_1.events = 1;
      psVar9 = (string *)0x1;
      __n = __rtime;
      iVar3 = zmq::poll((pollfd *)&poller_1,1,(int)__rtime->__r);
      if (iVar3 == 0) {
        zmq::socket_t::close(&brokerReqTerm,(int)psVar9);
      }
      else {
        psVar9 = (string *)&poller;
        zmq::message_t::message_t((message_t *)psVar9);
        zmq::detail::socket_base::recv
                  (&brokerReqTerm.super_socket_base,(int)psVar9,(void *)0x0,(size_t)__n,iVar4);
        zmq::socket_t::close(&brokerReqTerm,(int)psVar9);
        local_190._M_dataplus._M_p = (pointer)0x41a;
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                  ((duration<long,_std::ratio<1L,_1000L>_> *)&local_190);
        zmq::message_t::~message_t((message_t *)&poller);
      }
      bVar1 = true;
      uVar5 = 0;
      bVar2 = false;
      while (iVar3 = (int)psVar9, bVar1) {
        context_ = ((ctx.super___shared_ptr<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                   zcontext)._M_t.
                   super___uniq_ptr_impl<zmq::context_t,_std::default_delete<zmq::context_t>_>._M_t.
                   super__Tuple_impl<0UL,_zmq::context_t_*,_std::default_delete<zmq::context_t>_>.
                   super__Head_base<0UL,_zmq::context_t_*,_false>._M_head_impl;
        zmq::socket_t::socket_t((socket_t *)&poller,context_,4);
        sVar7 = repSocket.super_socket_base;
        repSocket.super_socket_base._handle =
             poller.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
             super__Vector_impl_data._M_start;
        poller.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)sVar7._handle;
        zmq::socket_t::close((socket_t *)&poller,(int)context_);
        if ((this->super_NetworkCommsInterface).super_CommsInterface.serverMode == true) {
          poller.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
          super__Vector_impl_data._M_start =
               (pointer)CONCAT44(poller.
                                 super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>
                                 ._M_impl.super__Vector_impl_data._M_start._4_4_,500);
          zmq::detail::socket_base::setsockopt<int>
                    (&repSocket.super_socket_base,0x11,(int *)&poller);
        }
        poller.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x64;
        std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                  ((duration<long,_std::ratio<1L,_1000L>_> *)&poller);
        psVar9 = local_230;
        bVar2 = bindzmqSocket(&repSocket,local_230,
                              (this->super_NetworkCommsInterface).PortNumber.
                              super___atomic_base<int>._M_i + 1,
                              (milliseconds)
                              (this->super_NetworkCommsInterface).super_CommsInterface.
                              connectionTimeout.__r,(milliseconds)0xc8);
        if (!bVar2) {
          zmq::socket_t::close(&repSocket,(int)psVar9);
          iVar3 = (int)psVar9;
          if (8 < uVar5) goto LAB_00260d1a;
          std::this_thread::sleep_for<long,std::ratio<1l,1000l>>
                    ((duration<long,_std::ratio<1L,_1000L>_> *)__rtime);
        }
        bVar1 = !bVar2;
        uVar5 = uVar5 + 1;
      }
      if (bVar2 == false) {
LAB_00260d1a:
        zmq::socket_t::close(&pullSocket,iVar3);
        zmq::socket_t::close(&repSocket,iVar3);
        LOCK();
        (this->super_NetworkCommsInterface).super_CommsInterface.disconnecting._M_base._M_i = true;
        UNLOCK();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_190,"Unable to bind zmq reply even after force termination ",
                   &local_231);
        gmlc::networking::makePortAddress
                  ((string *)&local_150,local_230,
                   (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i + 1)
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&poller,
                       &local_190,&local_150);
        message_03._M_str =
             (char *)poller.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>.
                     _M_impl.super__Vector_impl_data._M_start;
        message_03._M_len =
             (size_t)poller.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
        CommsInterface::logError((CommsInterface *)this,message_03);
        std::__cxx11::string::~string((string *)&poller);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_190);
        status = ERRORED;
        CommsInterface::setRxStatus((CommsInterface *)this,ERRORED);
        std::__cxx11::string::~string((string *)&str);
        ActionMessage::~ActionMessage(&M);
        zmq::socket_t::close(&brokerReqTerm,status);
        goto LAB_00260a78;
      }
      std::__cxx11::string::~string((string *)&str);
      ActionMessage::~ActionMessage(&M);
      zmq::socket_t::close(&brokerReqTerm,iVar3);
    }
  }
  psVar9 = &(this->super_NetworkCommsInterface).super_CommsInterface.localTargetAddress;
  uVar11 = 200;
  psVar10 = psVar9;
  bVar1 = bindzmqSocket(&pullSocket,psVar9,
                        (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i
                        ,(milliseconds)
                         (this->super_NetworkCommsInterface).super_CommsInterface.connectionTimeout.
                         __r,(milliseconds)0xc8);
  iVar3 = (int)psVar10;
  if (bVar1) {
    std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::vector
              (&poller,3,(allocator_type *)&M);
    (poller.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
     super__Vector_impl_data._M_start)->socket = controlSocket.super_socket_base._handle;
    sVar7._handle =
         (void *)CONCAT62((int6)((ulong)controlSocket.super_socket_base._handle >> 0x10),1);
    (poller.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
     super__Vector_impl_data._M_start)->events = 1;
    poller.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
    super__Vector_impl_data._M_start[1].socket = pullSocket.super_socket_base._handle;
    poller.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
    super__Vector_impl_data._M_start[1].events = 1;
    if ((this->super_NetworkCommsInterface).super_CommsInterface.serverMode == true) {
      poller.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
      super__Vector_impl_data._M_start[2].socket = repSocket.super_socket_base._handle;
      poller.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
      super__Vector_impl_data._M_start[2].events = 1;
      sVar7 = repSocket.super_socket_base;
    }
    else {
      std::vector<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::resize(&poller,2);
    }
    CommsInterface::setRxStatus((CommsInterface *)this,CONNECTED);
    uVar8 = extraout_RDX;
    do {
      iVar3 = zmq::poll((pollfd *)&poller,1000,(int)uVar8);
      uVar8 = extraout_RDX_00;
      if (iVar3 < 1) {
LAB_00260990:
        uVar5 = 0;
        if (((this->super_NetworkCommsInterface).super_CommsInterface.requestDisconnect._M_base._M_i
            & 1U) != 0) break;
      }
      else {
        zmq::message_t::message_t((message_t *)&M);
        iVar3 = (int)&M;
        if (((poller.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
              super__Vector_impl_data._M_start)->revents & 1) == 0) {
LAB_0026091c:
          if ((poller.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
               super__Vector_impl_data._M_start[1].revents & 1) != 0) {
            zmq::detail::socket_base::recv
                      (&pullSocket.super_socket_base,iVar3,(void *)0x0,(size_t)sVar7._handle,
                       (int)uVar11);
            iVar4 = processIncomingMessage(this,(message_t *)&M);
            uVar5 = 7;
            if (iVar4 < 0) goto LAB_00260983;
          }
          uVar5 = 0;
          if (((this->super_NetworkCommsInterface).super_CommsInterface.serverMode == true) &&
             (uVar5 = 0,
             (poller.super__Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>._M_impl.
              super__Vector_impl_data._M_start[2].revents & 1) != 0)) {
            zmq::detail::socket_base::recv
                      (&repSocket.super_socket_base,iVar3,(void *)0x0,(size_t)sVar7._handle,
                       (int)uVar11);
            uVar5 = replyToIncomingMessage(this,(message_t *)&M,&repSocket);
            uVar5 = uVar5 >> 0x1f | 6;
          }
        }
        else {
          zmq::detail::socket_base::recv
                    (&controlSocket.super_socket_base,iVar3,(void *)0x0,(size_t)sVar7._handle,
                     (int)uVar11);
          iVar4 = processIncomingMessage(this,(message_t *)&M);
          uVar5 = 7;
          if (-1 < iVar4) goto LAB_0026091c;
        }
LAB_00260983:
        zmq::message_t::~message_t((message_t *)&M);
        uVar8 = extraout_RDX_01;
        if (uVar5 == 0) goto LAB_00260990;
      }
    } while (uVar5 != 7);
    LOCK();
    (this->super_NetworkCommsInterface).super_CommsInterface.disconnecting._M_base._M_i = true;
    UNLOCK();
    status = TERMINATED;
    CommsInterface::setRxStatus((CommsInterface *)this,TERMINATED);
    CLI::std::_Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_>::~_Vector_base
              ((_Vector_base<zmq_pollitem_t,_std::allocator<zmq_pollitem_t>_> *)&poller);
  }
  else {
    zmq::socket_t::close(&pullSocket,iVar3);
    zmq::socket_t::close(&repSocket,iVar3);
    LOCK();
    (this->super_NetworkCommsInterface).super_CommsInterface.disconnecting._M_base._M_i = true;
    UNLOCK();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&poller,"Unable to bind zmq pull socket giving up ",
               (allocator<char> *)&local_190);
    gmlc::networking::makePortAddress
              (&str,psVar9,
               (this->super_NetworkCommsInterface).PortNumber.super___atomic_base<int>._M_i);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&M,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&poller,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str);
    message._M_str = (char *)M._0_8_;
    message._M_len._0_4_ = M.source_id.gid;
    message._M_len._4_4_ = M.source_handle.hid;
    CommsInterface::logError((CommsInterface *)this,message);
    std::__cxx11::string::~string((string *)&M);
    std::__cxx11::string::~string((string *)&str);
    std::__cxx11::string::~string((string *)&poller);
    status = ERRORED;
    CommsInterface::setRxStatus((CommsInterface *)this,ERRORED);
  }
LAB_00260a78:
  zmq::socket_t::close(&repSocket,status);
  std::__cxx11::string::~string((string *)&controlsockString);
  zmq::socket_t::close(&controlSocket,status);
  zmq::socket_t::close(&pullSocket,status);
  CLI::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &ctx.super___shared_ptr<ZmqContextManager,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

void ZmqComms::queue_rx_function()
{
    auto ctx = ZmqContextManager::getContextPointer();
    zmq::socket_t pullSocket(ctx->getBaseContext(), ZMQ_PULL);
    pullSocket.setsockopt(ZMQ_LINGER, 200);
    zmq::socket_t controlSocket(ctx->getBaseContext(), ZMQ_PAIR);
    std::string controlsockString =
        std::string("inproc://") + name + '_' + getRandomID() + "_control";
    try {
        controlSocket.bind(controlsockString.c_str());
    }
    catch (const zmq::error_t& e) {
        logError(std::string("binding error on internal comms socket:") + e.what());
        setRxStatus(ConnectionStatus::ERRORED);
        return;
    }
    controlSocket.setsockopt(ZMQ_LINGER, 200);

    zmq::socket_t repSocket(ctx->getBaseContext(), ZMQ_REP);
    if (serverMode) {
        repSocket.setsockopt(ZMQ_LINGER, 500);
    }

    while (PortNumber == -1) {
        zmq::message_t msg;
        controlSocket.recv(msg);
        if (msg.size() < 10) {
            continue;
        }
        ActionMessage M(static_cast<std::byte*>(msg.data()), msg.size());

        if (isProtocolCommand(M)) {
            if (M.messageID == PORT_DEFINITIONS) {
                loadPortDefinitions(M);
            } else if (M.messageID == NAME_NOT_FOUND) {
                logError(std::string("broker name ") + brokerName +
                         " does not match broker connection");
                disconnecting = true;
                setRxStatus(ConnectionStatus::ERRORED);
                return;
            } else if (M.messageID == DISCONNECT || M.messageID == CLOSE_RECEIVER) {
                disconnecting = true;
                setRxStatus(ConnectionStatus::TERMINATED);
                return;
            } else if (M.messageID == DISCONNECT_ERROR) {
                disconnecting = true;
                setRxStatus(ConnectionStatus::ERRORED);
                return;
            }
        }
    }
    if (serverMode) {
        auto bindsuccess =
            bindzmqSocket(repSocket, localTargetAddress, PortNumber + 1, connectionTimeout);
        if (!bindsuccess) {
            if (forceConnection) {
                logWarning("attempting to override existing broker and force network connection");
                zmq::socket_t brokerReqTerm(ctx->getBaseContext(), ZMQ_REQ);
                brokerReqTerm.setsockopt(ZMQ_LINGER, 50);
                try {
                    repSocket.close();
                    brokerReqTerm.connect(makePortAddress(localTargetAddress, PortNumber + 1));
                    ActionMessage term(CMD_GLOBAL_ERROR);
                    term.messageID = HELICS_ERROR_TERMINATED;
                    term.payload = "force termination for new broker";
                    auto str = (useJsonSerialization) ? term.to_json_string() : term.to_string();

                    brokerReqTerm.send(str);
                    zmq::pollitem_t poller;
                    poller.socket = static_cast<void*>(brokerReqTerm);
                    poller.events = ZMQ_POLLIN;
                    int rc = zmq::poll(&poller, 1, connectionTimeout);
                    if (rc != 0) {
                        zmq::message_t msg;
                        brokerReqTerm.recv(msg);

                        brokerReqTerm.close();
                        // this sleep is to exceed the linger timeout on the port
                        std::this_thread::sleep_for(std::chrono::milliseconds(1050));
                    } else {
                        brokerReqTerm.close();
                    }
                    bool notConnected = true;
                    int cnt = 0;
                    while (notConnected) {
                        ++cnt;
                        repSocket = zmq::socket_t(ctx->getBaseContext(), ZMQ_REP);
                        if (serverMode) {
                            repSocket.setsockopt(ZMQ_LINGER, 500);
                        }
                        std::this_thread::sleep_for(std::chrono::milliseconds(100));
                        bindsuccess = bindzmqSocket(repSocket,
                                                    localTargetAddress,
                                                    PortNumber + 1,
                                                    connectionTimeout);
                        if (bindsuccess) {
                            notConnected = false;
                        } else {
                            repSocket.close();
                            if (cnt >= 10) {
                                break;
                            }
                            std::this_thread::sleep_for(connectionTimeout);
                        }
                    }

                    if (!bindsuccess) {
                        pullSocket.close();
                        repSocket.close();
                        disconnecting = true;
                        logError(
                            std::string("Unable to bind zmq reply even after force termination ") +
                            makePortAddress(localTargetAddress, PortNumber + 1));
                        setRxStatus(ConnectionStatus::ERRORED);
                        return;
                    }
                }
                catch (zmq::error_t& ze) {
                    pullSocket.close();
                    repSocket.close();
                    disconnecting = true;
                    logError(
                        std::string(
                            "unable to make connection with existing server, force override failed with error ") +
                        std::string(ze.what()) + " on " +
                        makePortAddress(localTargetAddress, PortNumber + 1));
                    setRxStatus(ConnectionStatus::ERRORED);
                    return;
                }
            } else {
                pullSocket.close();
                repSocket.close();
                disconnecting = true;
                logError(std::string("Unable to bind zmq reply socket giving up ") +
                         makePortAddress(localTargetAddress, PortNumber + 1));
                setRxStatus(ConnectionStatus::ERRORED);
                return;
            }
        }
    }

    auto bindsuccess = bindzmqSocket(pullSocket, localTargetAddress, PortNumber, connectionTimeout);

    if (!bindsuccess) {
        pullSocket.close();
        repSocket.close();
        disconnecting = true;
        logError(std::string("Unable to bind zmq pull socket giving up ") +
                 makePortAddress(localTargetAddress, PortNumber));
        setRxStatus(ConnectionStatus::ERRORED);
        return;
    }

    std::vector<zmq::pollitem_t> poller(3);
    poller[0].socket = static_cast<void*>(controlSocket);
    poller[0].events = ZMQ_POLLIN;
    poller[1].socket = static_cast<void*>(pullSocket);
    poller[1].events = ZMQ_POLLIN;
    if (serverMode) {
        poller[2].socket = static_cast<void*>(repSocket);
        poller[2].events = ZMQ_POLLIN;
    } else {
        poller.resize(2);
    }
    setRxStatus(ConnectionStatus::CONNECTED);

    while (true) {
        auto rc = zmq::poll(poller, std::chrono::milliseconds(1000));
        if (rc > 0) {
            zmq::message_t msg;
            if (zmq::has_message(poller[0])) {
                controlSocket.recv(msg);

                auto status = processIncomingMessage(msg);
                if (status < 0) {
                    break;
                }
            }
            if (zmq::has_message(poller[1])) {
                pullSocket.recv(msg);
                auto status = processIncomingMessage(msg);
                if (status < 0) {
                    break;
                }
            }
            if (serverMode) {
                if (zmq::has_message(poller[2])) {
                    repSocket.recv(msg);
                    auto status = replyToIncomingMessage(msg, repSocket);
                    if (status < 0) {
                        break;
                    }
                    continue;
                }
            }
        }
        if (requestDisconnect.load(std::memory_order_acquire)) {
            break;
        }
    }
    disconnecting = true;
    setRxStatus(ConnectionStatus::TERMINATED);
}